

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O2

void __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<short,_float>::delay_neighbor
          (Flag_complex_edge_collapser<short,_float> *this,short u,short v,float f)

{
  mapped_type *pmVar1;
  undefined6 in_register_00000032;
  short local_1c;
  short local_1a;
  
  local_1c = v;
  local_1a = u;
  pmVar1 = boost::container::flat_map<short,_float,_std::less<short>,_void>::priv_subscript
                     ((this->neighbors).
                      super__Vector_base<boost::container::flat_map<short,_float,_std::less<short>,_void>,_std::allocator<boost::container::flat_map<short,_float,_std::less<short>,_void>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      (int)CONCAT62(in_register_00000032,u),&local_1c);
  *pmVar1 = f;
  pmVar1 = boost::container::flat_map<short,_float,_std::less<short>,_void>::priv_subscript
                     ((this->neighbors).
                      super__Vector_base<boost::container::flat_map<short,_float,_std::less<short>,_void>,_std::allocator<boost::container::flat_map<short,_float,_std::less<short>,_void>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_1c,&local_1a);
  *pmVar1 = f;
  return;
}

Assistant:

void delay_neighbor(Vertex u, Vertex v, Filtration_value f) {
    neighbors[u][v]=f;
    neighbors[v][u]=f;
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    neighbors_dense(u,v)=f;
    neighbors_dense(v,u)=f;
#endif
  }